

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Orphan<capnp::DynamicValue> * __thiscall
capnp::compiler::ValueTranslator::compileValueInner
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,ValueTranslator *this,Reader src,
          Type type)

{
  Resolver *pRVar1;
  ErrorReporter *pEVar2;
  undefined2 *puVar3;
  Reader src_00;
  Builder builder;
  Reader assignments;
  Reader copyFrom;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  word *pwVar8;
  anon_union_8_2_eba6ea51_for_Type_5 aVar9;
  undefined1 auVar10 [8];
  ValueTranslator *pVVar11;
  Which WVar12;
  int iVar13;
  Schema SVar14;
  char *__s1;
  StructSchema SVar15;
  int64_t iVar16;
  ulong uVar17;
  WirePointer *pWVar18;
  undefined1 auVar19 [8];
  undefined8 uVar20;
  RawBrandedSchema *pRVar21;
  size_t sVar22;
  Schema elementCount;
  uint index;
  undefined2 uVar23;
  ulong uVar24;
  OrphanBuilder *builder_00;
  char (*in_R8) [2];
  undefined4 uVar25;
  undefined4 uVar26;
  Type type_00;
  StringPtr name;
  ArrayPtr<const_capnp::word> array;
  ReaderOptions options;
  Array<capnp::word> copy;
  NullableValue<kj::Array<const_unsigned_char>_> data;
  NullableValue<capnp::DynamicValue::Reader> constValue;
  Orphan<capnp::DynamicStruct> result;
  Reader srcList;
  Type local_3e8;
  undefined1 local_3d8 [32];
  OrphanBuilder local_3b8;
  Array<capnp::word> local_388;
  EVP_PKEY_CTX local_368;
  anon_union_8_2_eba6ea51_for_Type_5 local_360;
  OrphanBuilder OStack_358;
  undefined1 local_338 [8];
  undefined1 auStack_330 [8];
  undefined1 auStack_328 [256];
  undefined1 local_228 [16];
  SegmentBuilder *pSStack_218;
  WirePointer *local_210;
  StructPointerCount SStack_204;
  word *pwStack_208;
  ListElementCount local_200;
  ValueTranslator *local_1f0;
  anon_union_8_2_eba6ea51_for_Type_5 local_1e8;
  SegmentBuilder *pSStack_1e0;
  WirePointer *local_1d8;
  uint uStack_1d0;
  undefined1 local_1b8 [48];
  SegmentReader *local_188;
  ListReader local_180;
  Builder local_150;
  StructReader local_120;
  Reader local_f0;
  Reader local_a8;
  StructReader local_60;
  
  local_3e8.field_4 = type.field_4;
  uVar20 = type._0_8_;
  puVar3 = (undefined2 *)src._reader.data;
  if (src._reader.dataSize < 0x10) {
    uVar23 = 0;
  }
  else {
    uVar23 = *puVar3;
  }
  local_3e8.listDepth = type.listDepth;
  local_3e8.baseType = type.baseType;
  pRVar21 = (RawBrandedSchema *)src._reader.segment;
  SVar14.raw = (RawBrandedSchema *)src._reader.capTable;
  pWVar18 = src._reader.pointers;
  local_3e8._0_8_ = uVar20;
  switch(uVar23) {
  case 0:
    break;
  case 1:
    if (src._reader.dataSize < 0x80) {
      iVar16 = 0;
    }
    else {
      iVar16 = *(int64_t *)(puVar3 + 4);
    }
    __return_storage_ptr__->type = UINT;
    goto LAB_001dd8c0;
  case 2:
    if (src._reader.dataSize < 0x80) {
      uVar17 = 0;
    }
    else {
      uVar17 = *(ulong *)(puVar3 + 4);
    }
    if (uVar17 < 0x8000000000000001) {
      __return_storage_ptr__->type = INT;
      (__return_storage_ptr__->field_1).intValue = -uVar17;
      goto LAB_001de4c3;
    }
    uVar17 = 0;
    uVar24 = 0;
    if (0x3f < src._reader.dataSize) {
      uVar24 = (ulong)*(uint *)(puVar3 + 2);
    }
    if (0x9f < src._reader.dataSize) {
      uVar17 = (ulong)*(uint *)(puVar3 + 8);
    }
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar24,uVar17,"Integer is too big to be negative.",0x23);
    break;
  case 3:
    uVar25 = 0;
    uVar26 = 0;
    if (0x7f < src._reader.dataSize) {
      uVar25 = (undefined4)*(undefined8 *)(puVar3 + 4);
      uVar26 = (undefined4)((ulong)*(undefined8 *)(puVar3 + 4) >> 0x20);
    }
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = CONCAT44(uVar26,uVar25);
    goto LAB_001de4c3;
  case 4:
    if ((local_3e8.baseType == DATA) && (local_3e8.listDepth == '\0')) {
      if (src._reader.pointerCount == 0) {
        src._reader.nestingLimit = 0x7fffffff;
        SVar14.raw = (RawBrandedSchema *)0x0;
        pWVar18 = (WirePointer *)0x0;
        pRVar21 = (RawBrandedSchema *)0x0;
      }
      auStack_328._8_4_ = src._reader.nestingLimit;
      local_338 = (undefined1  [8])pRVar21;
      auStack_330 = (undefined1  [8])SVar14.raw;
      auStack_328._0_8_ = pWVar18;
      capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_338,(void *)0x0,0);
      capnp::_::OrphanBuilder::copy
                ((EVP_PKEY_CTX *)local_338,(EVP_PKEY_CTX *)(this->orphanage).arena);
      local_3d8._16_8_ = auStack_328._0_8_;
      local_3d8._24_8_ = auStack_328._8_8_;
      local_3d8._0_8_ = local_338;
      local_3d8._8_8_ = auStack_330;
      _auStack_330 = (undefined1  [16])capnp::_::OrphanBuilder::asData((OrphanBuilder *)local_3d8);
      local_338._0_4_ = 7;
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)local_338,(OrphanBuilder *)local_3d8);
      DynamicValue::Builder::~Builder((Builder *)local_338);
    }
    else {
      if (src._reader.pointerCount == 0) {
        src._reader.nestingLimit = 0x7fffffff;
        SVar14.raw = (RawBrandedSchema *)0x0;
        pWVar18 = (WirePointer *)0x0;
        pRVar21 = (RawBrandedSchema *)0x0;
      }
      auStack_328._8_4_ = src._reader.nestingLimit;
      local_338 = (undefined1  [8])pRVar21;
      auStack_330 = (undefined1  [8])SVar14.raw;
      auStack_328._0_8_ = pWVar18;
      capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_338,(void *)0x0,0);
      capnp::_::OrphanBuilder::copy
                ((EVP_PKEY_CTX *)local_338,(EVP_PKEY_CTX *)(this->orphanage).arena);
      local_3d8._16_8_ = auStack_328._0_8_;
      local_3d8._24_8_ = auStack_328._8_8_;
      local_3d8._0_8_ = local_338;
      local_3d8._8_8_ = auStack_330;
      capnp::_::OrphanBuilder::asText((Builder *)local_228,(OrphanBuilder *)local_3d8);
      auStack_328._8_8_ = pSStack_218;
      auStack_328._0_8_ = local_228._8_8_;
      auStack_330 = (undefined1  [8])local_228._0_8_;
      local_338._0_4_ = 6;
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)local_338,(OrphanBuilder *)local_3d8);
      DynamicValue::Builder::~Builder((Builder *)local_338);
    }
LAB_001de2e7:
    if ((RawBrandedSchema *)local_3d8._8_8_ == (RawBrandedSchema *)0x0) {
      return __return_storage_ptr__;
    }
    builder_00 = (OrphanBuilder *)local_3d8;
LAB_001de406:
    capnp::_::OrphanBuilder::euthanize(builder_00);
    return __return_storage_ptr__;
  case 5:
    if (src._reader.pointerCount == 0) {
      SVar14.raw = (RawBrandedSchema *)0x0;
      pWVar18 = (WirePointer *)0x0;
      pRVar21 = (RawBrandedSchema *)0x0;
      src._reader.nestingLimit = 0x7fffffff;
    }
    local_338 = (undefined1  [8])pRVar21;
    local_1f0 = this;
    auStack_330 = (undefined1  [8])SVar14.raw;
    auStack_328._0_8_ = pWVar18;
    auStack_328._8_4_ = src._reader.nestingLimit;
    capnp::_::PointerReader::getStruct
              ((StructReader *)local_228,(PointerReader *)local_338,(word *)0x0);
    auStack_328._0_8_ = (WirePointer *)0x0;
    local_338 = (undefined1  [8])(RawBrandedSchema *)0x0;
    auStack_330 = (undefined1  [8])(RawBrandedSchema *)0x0;
    auStack_328._8_4_ = 0x7fffffff;
    if (SStack_204 != 0) {
      auStack_328._0_8_ = local_210;
      local_338 = (undefined1  [8])local_228._0_8_;
      auStack_330 = (undefined1  [8])local_228._8_8_;
      auStack_328._8_4_ = local_200;
    }
    name.content = (ArrayPtr<const_char>)
                   capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)local_338,(void *)0x0,0);
    sVar22 = name.content.size_;
    __s1 = name.content.ptr;
    if ((local_3e8.baseType == ENUM) && (local_3e8.listDepth == '\0')) {
      local_3d8._0_8_ = Type::asEnum(&local_3e8);
      EnumSchema::findEnumerantByName
                ((Maybe<capnp::EnumSchema::Enumerant> *)local_338,(EnumSchema *)local_3d8,name);
      if (local_338[0] == (EVP_PKEY_CTX)0x1) {
        __return_storage_ptr__->type = ENUM;
        (__return_storage_ptr__->field_1).intValue = (int64_t)auStack_330;
        (__return_storage_ptr__->field_1).enumValue.value = auStack_328._0_2_;
        goto LAB_001de4c3;
      }
    }
    else {
      if (sVar22 == 4) {
        iVar13 = bcmp(__s1,"nan",3);
        if (iVar13 == 0) {
          __return_storage_ptr__->type = FLOAT;
          iVar16 = 0x7ff8000000000000;
        }
        else {
          iVar13 = bcmp(__s1,"inf",3);
          if (iVar13 != 0) goto LAB_001ddc28;
          __return_storage_ptr__->type = FLOAT;
          iVar16 = 0x7ff0000000000000;
        }
LAB_001dd8c0:
        (__return_storage_ptr__->field_1).intValue = iVar16;
        goto LAB_001de4c3;
      }
      if (sVar22 == 6) {
        iVar13 = bcmp(__s1,"false",5);
        if (iVar13 == 0) {
          __return_storage_ptr__->type = BOOL;
          (__return_storage_ptr__->field_1).boolValue = false;
          goto LAB_001de4c3;
        }
      }
      else if (sVar22 == 5) {
        iVar13 = bcmp(__s1,"void",4);
        if (iVar13 == 0) {
          __return_storage_ptr__->type = VOID;
          goto LAB_001de4c3;
        }
        iVar13 = bcmp(__s1,"true",4);
        if (iVar13 == 0) {
          __return_storage_ptr__->type = BOOL;
          (__return_storage_ptr__->field_1).boolValue = true;
          goto LAB_001de4c3;
        }
      }
    }
LAB_001ddc28:
    pVVar11 = local_1f0;
    (**local_1f0->resolver->_vptr_Resolver)(local_3d8);
    local_338[0] = (EVP_PKEY_CTX)local_3d8[0];
    if (local_3d8[0] == true) {
      DynamicValue::Reader::Reader((Reader *)auStack_330,(Reader *)(local_3d8 + 8));
    }
    if (local_3d8[0] == true) {
      DynamicValue::Reader::~Reader((Reader *)(local_3d8 + 8));
    }
    if (local_338[0] == (EVP_PKEY_CTX)0x1) {
      DynamicValue::Reader::Reader(&local_a8,(Reader *)auStack_330);
      Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
                (__return_storage_ptr__,&pVVar11->orphanage,&local_a8);
      DynamicValue::Reader::~Reader(&local_a8);
      goto LAB_001ddcf8;
    }
    goto LAB_001ddce4;
  case 6:
    if (local_3e8.listDepth != '\0') {
      type_00 = (Type)Type::asList(&local_3e8);
      if (src._reader.pointerCount == 0) {
        src._reader.nestingLimit = 0x7fffffff;
        SVar14.raw = (RawBrandedSchema *)0x0;
        pWVar18 = (WirePointer *)0x0;
        pRVar21 = (RawBrandedSchema *)0x0;
      }
      auStack_328._0_8_ = pWVar18;
      auStack_330 = (undefined1  [8])SVar14.raw;
      auStack_328._8_4_ = src._reader.nestingLimit;
      local_338 = (undefined1  [8])pRVar21;
      capnp::_::PointerReader::getList
                ((ListReader *)&local_1e8,(PointerReader *)local_338,INLINE_COMPOSITE,(word *)0x0);
      Orphanage::newOrphan
                ((Orphan<capnp::DynamicList> *)&local_368,&this->orphanage,(ListSchema)type_00,
                 uStack_1d0);
      Orphan<capnp::DynamicList>::get((Builder *)local_228,(Orphan<capnp::DynamicList> *)&local_368)
      ;
      if (uStack_1d0 != 0) {
        index = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_120,(ListReader *)&local_1e8,index);
          src_00._reader.capTable._0_4_ = (int)local_120.capTable;
          src_00._reader.segment = local_120.segment;
          src_00._reader.capTable._4_4_ = (int)((ulong)local_120.capTable >> 0x20);
          src_00._reader.data._0_4_ = (int)local_120.data;
          src_00._reader.data._4_4_ = (int)((ulong)local_120.data >> 0x20);
          src_00._reader.pointers._0_4_ = (int)local_120.pointers;
          src_00._reader.pointers._4_4_ = (int)((ulong)local_120.pointers >> 0x20);
          src_00._reader.dataSize = local_120.dataSize;
          src_00._reader._36_4_ = local_120._36_4_;
          src_00._reader.nestingLimit = local_120.nestingLimit;
          src_00._reader._44_4_ = local_120._44_4_;
          compileValue((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)local_3d8,this,src_00,type_00);
          local_338[0] = (EVP_PKEY_CTX)local_3d8[0];
          if (local_3d8[0] == true) {
            auStack_328._8_8_ = local_3d8._24_8_;
            auStack_328._0_8_ = local_3d8._16_8_;
            auStack_330 = (undefined1  [8])local_3d8._8_8_;
            auStack_328._32_8_ = local_3b8.capTable;
            auStack_328._40_8_ = local_3b8.location;
            auStack_328._16_8_ = local_3b8.tag.content;
            auStack_328._24_8_ = local_3b8.segment;
            local_3b8.segment = (SegmentBuilder *)0x0;
            local_3b8.location = (word *)0x0;
          }
          if ((local_3d8[0] != false) && (local_3b8.segment != (SegmentBuilder *)0x0)) {
            capnp::_::OrphanBuilder::euthanize(&local_3b8);
          }
          if (local_338[0] == (EVP_PKEY_CTX)0x1) {
            DynamicList::Builder::adopt
                      ((Builder *)local_228,index,(Orphan<capnp::DynamicValue> *)auStack_330);
          }
          if ((local_338[0] == (EVP_PKEY_CTX)0x1) &&
             ((SegmentReader *)auStack_328._24_8_ != (SegmentReader *)0x0)) {
            capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(auStack_328 + 0x10));
          }
          index = index + 1;
        } while (index < uStack_1d0);
      }
      Orphan<capnp::DynamicList>::get((Builder *)local_3d8,(Orphan<capnp::DynamicList> *)&local_368)
      ;
      auStack_328._40_8_ = local_3b8.capTable;
      auStack_328._24_8_ = local_3b8.tag.content;
      auStack_328._32_8_ = local_3b8.segment;
      auStack_328._8_8_ = local_3d8._16_8_;
      auStack_328._16_8_ = local_3d8._24_8_;
      local_338._0_4_ = 8;
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(Builder *)local_338,&OStack_358);
      DynamicValue::Builder::~Builder((Builder *)local_338);
      if (OStack_358.segment == (SegmentBuilder *)0x0) {
        return __return_storage_ptr__;
      }
      capnp::_::OrphanBuilder::euthanize(&OStack_358);
      return __return_storage_ptr__;
    }
    pEVar2 = this->errorReporter;
    makeTypeName((String *)local_3d8,this,type);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)local_338,(kj *)"Type mismatch; expected ",(char (*) [25])local_3d8,
               (String *)0x262a08,in_R8);
    auVar19 = local_338;
    if ((Schema)auStack_330 == (Schema)0x0) {
      auVar19 = (undefined1  [8])(SegmentReader *)0x28616d;
    }
    uVar17 = 0;
    uVar24 = 0;
    if (0x3f < src._reader.dataSize) {
      uVar24 = (ulong)*(uint *)(puVar3 + 2);
    }
    if (0x9f < src._reader.dataSize) {
      uVar17 = (ulong)*(uint *)(puVar3 + 8);
    }
    (**pEVar2->_vptr_ErrorReporter)
              (pEVar2,uVar24,uVar17,auVar19,
               (long)auStack_330 + (ulong)((Schema)auStack_330 == (Schema)0x0));
    auVar19 = local_338;
    if (local_338 != (undefined1  [8])0x0) {
      auVar10 = auStack_330;
      uVar20 = auStack_328._0_8_;
      local_338 = (undefined1  [8])0x0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = auStack_328._0_8_;
      _auStack_330 = auVar6 << 0x40;
      (*(code *)(*(Arena **)uVar20)->_vptr_Arena)(uVar20,auVar19,1,auVar10,auVar10,0);
    }
    uVar7 = local_3d8._8_8_;
    uVar20 = local_3d8._0_8_;
    if ((RawBrandedSchema *)local_3d8._0_8_ != (RawBrandedSchema *)0x0) {
      local_3d8._0_8_ = (RawBrandedSchema *)0x0;
      local_3d8._8_8_ = 0;
      (**(code **)*(WirePointer *)local_3d8._16_8_)(local_3d8._16_8_,uVar20,1,uVar7,uVar7,0);
    }
    break;
  case 7:
    if ((local_3e8.baseType == STRUCT) && (local_3e8.listDepth == '\0')) {
      SVar15 = Type::asStruct(&local_3e8);
      Orphanage::newOrphan((Orphan<capnp::DynamicStruct> *)local_228,&this->orphanage,SVar15);
      Orphan<capnp::DynamicStruct>::get(&local_150,(Orphan<capnp::DynamicStruct> *)local_228);
      if (src._reader.pointerCount == 0) {
        src._reader.nestingLimit = 0x7fffffff;
        SVar14.raw = (RawBrandedSchema *)0x0;
        pWVar18 = (WirePointer *)0x0;
        pRVar21 = (RawBrandedSchema *)0x0;
      }
      auStack_328._8_4_ = src._reader.nestingLimit;
      local_338 = (undefined1  [8])pRVar21;
      auStack_330 = (undefined1  [8])SVar14.raw;
      auStack_328._0_8_ = pWVar18;
      capnp::_::PointerReader::getList
                (&local_180,(PointerReader *)local_338,INLINE_COMPOSITE,(word *)0x0);
      builder.builder.segment._0_4_ = (int)local_150.builder.segment;
      builder.schema.super_Schema.raw = local_150.schema.super_Schema.raw;
      builder.builder.segment._4_4_ = (int)((ulong)local_150.builder.segment >> 0x20);
      builder.builder.capTable._0_4_ = (int)local_150.builder.capTable;
      builder.builder.capTable._4_4_ = (int)((ulong)local_150.builder.capTable >> 0x20);
      builder.builder.data._0_4_ = (int)local_150.builder.data;
      builder.builder.data._4_4_ = (int)((ulong)local_150.builder.data >> 0x20);
      builder.builder.pointers._0_4_ = (int)local_150.builder.pointers;
      builder.builder.pointers._4_4_ = (int)((ulong)local_150.builder.pointers >> 0x20);
      builder.builder.dataSize = local_150.builder.dataSize;
      builder.builder._36_4_ = local_150.builder._36_4_;
      assignments.reader.capTable = local_180.capTable;
      assignments.reader.segment = local_180.segment;
      assignments.reader.ptr = local_180.ptr;
      assignments.reader.elementCount = local_180.elementCount;
      assignments.reader.step = local_180.step;
      assignments.reader.structDataSize = local_180.structDataSize;
      assignments.reader.structPointerCount = local_180.structPointerCount;
      assignments.reader.elementSize = local_180.elementSize;
      assignments.reader._39_1_ = local_180._39_1_;
      assignments.reader.nestingLimit = local_180.nestingLimit;
      assignments.reader._44_4_ = local_180._44_4_;
      fillStructValue(this,builder,assignments);
      Orphan<capnp::DynamicStruct>::get
                ((Builder *)local_3d8,(Orphan<capnp::DynamicStruct> *)local_228);
      auStack_328._24_8_ = local_3b8.tag.content;
      auStack_328._32_8_ = local_3b8.segment;
      auStack_328._8_8_ = local_3d8._16_8_;
      auStack_328._16_8_ = local_3d8._24_8_;
      auStack_328._0_8_ = local_3d8._8_8_;
      auStack_330 = (undefined1  [8])local_3d8._0_8_;
      local_338._0_4_ = 10;
      builder_00 = (OrphanBuilder *)(local_228 + 8);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(Builder *)local_338,builder_00);
      DynamicValue::Builder::~Builder((Builder *)local_338);
      if (pSStack_218 == (SegmentBuilder *)0x0) {
        return __return_storage_ptr__;
      }
      goto LAB_001de406;
    }
    pEVar2 = this->errorReporter;
    makeTypeName((String *)local_3d8,this,type);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)local_338,(kj *)"Type mismatch; expected ",(char (*) [25])local_3d8,
               (String *)0x262a08,in_R8);
    auVar19 = local_338;
    if ((Schema)auStack_330 == (Schema)0x0) {
      auVar19 = (undefined1  [8])(SegmentReader *)0x28616d;
    }
    uVar17 = 0;
    uVar24 = 0;
    if (0x3f < src._reader.dataSize) {
      uVar24 = (ulong)*(uint *)(puVar3 + 2);
    }
    if (0x9f < src._reader.dataSize) {
      uVar17 = (ulong)*(uint *)(puVar3 + 8);
    }
    (**pEVar2->_vptr_ErrorReporter)
              (pEVar2,uVar24,uVar17,auVar19,
               (long)auStack_330 + (ulong)((Schema)auStack_330 == (Schema)0x0));
    auVar19 = local_338;
    if (local_338 != (undefined1  [8])0x0) {
      auVar10 = auStack_330;
      uVar20 = auStack_328._0_8_;
      local_338 = (undefined1  [8])0x0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = auStack_328._0_8_;
      _auStack_330 = auVar4 << 0x40;
      (*(code *)(*(Arena **)uVar20)->_vptr_Arena)(uVar20,auVar19,1,auVar10,auVar10,0);
    }
    uVar7 = local_3d8._8_8_;
    uVar20 = local_3d8._0_8_;
    if ((RawBrandedSchema *)local_3d8._0_8_ != (RawBrandedSchema *)0x0) {
      local_3d8._0_8_ = (RawBrandedSchema *)0x0;
      local_3d8._8_8_ = 0;
      (**(code **)*(WirePointer *)local_3d8._16_8_)(local_3d8._16_8_,uVar20,1,uVar7,uVar7,0);
    }
    break;
  case 8:
    if ((local_3e8.baseType == DATA) && (local_3e8.listDepth == '\0')) {
      if (src._reader.pointerCount == 0) {
        src._reader.nestingLimit = 0x7fffffff;
        SVar14.raw = (RawBrandedSchema *)0x0;
        pWVar18 = (WirePointer *)0x0;
        pRVar21 = (RawBrandedSchema *)0x0;
      }
      auStack_328._8_4_ = src._reader.nestingLimit;
      local_338 = (undefined1  [8])pRVar21;
      auStack_330 = (undefined1  [8])SVar14.raw;
      auStack_328._0_8_ = pWVar18;
      capnp::_::PointerReader::getBlob<capnp::Data>((PointerReader *)local_338,(void *)0x0,0);
      capnp::_::OrphanBuilder::copy
                ((EVP_PKEY_CTX *)local_338,(EVP_PKEY_CTX *)(this->orphanage).arena);
      local_3d8._16_8_ = auStack_328._0_8_;
      local_3d8._24_8_ = auStack_328._8_8_;
      local_3d8._0_8_ = local_338;
      local_3d8._8_8_ = auStack_330;
      _auStack_330 = (undefined1  [16])capnp::_::OrphanBuilder::asData((OrphanBuilder *)local_3d8);
      local_338._0_4_ = 7;
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)local_338,(OrphanBuilder *)local_3d8);
      DynamicValue::Builder::~Builder((Builder *)local_338);
      goto LAB_001de2e7;
    }
    pEVar2 = this->errorReporter;
    makeTypeName((String *)local_3d8,this,type);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)local_338,(kj *)"Type mismatch; expected ",(char (*) [25])local_3d8,
               (String *)0x262a08,in_R8);
    auVar19 = local_338;
    if ((Schema)auStack_330 == (Schema)0x0) {
      auVar19 = (undefined1  [8])(SegmentReader *)0x28616d;
    }
    uVar17 = 0;
    uVar24 = 0;
    if (0x3f < src._reader.dataSize) {
      uVar24 = (ulong)*(uint *)(puVar3 + 2);
    }
    if (0x9f < src._reader.dataSize) {
      uVar17 = (ulong)*(uint *)(puVar3 + 8);
    }
    (**pEVar2->_vptr_ErrorReporter)
              (pEVar2,uVar24,uVar17,auVar19,
               (long)auStack_330 + (ulong)((Schema)auStack_330 == (Schema)0x0));
    auVar19 = local_338;
    if (local_338 != (undefined1  [8])0x0) {
      auVar10 = auStack_330;
      uVar20 = auStack_328._0_8_;
      local_338 = (undefined1  [8])0x0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = auStack_328._0_8_;
      _auStack_330 = auVar5 << 0x40;
      (*(code *)(*(Arena **)uVar20)->_vptr_Arena)(uVar20,auVar19,1,auVar10,auVar10,0);
    }
    uVar7 = local_3d8._8_8_;
    uVar20 = local_3d8._0_8_;
    if ((RawBrandedSchema *)local_3d8._0_8_ != (RawBrandedSchema *)0x0) {
      local_3d8._0_8_ = (RawBrandedSchema *)0x0;
      local_3d8._8_8_ = 0;
      (**(code **)*(WirePointer *)local_3d8._16_8_)(local_3d8._16_8_,uVar20,1,uVar7,uVar7,0);
    }
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    (**this->resolver->_vptr_Resolver)(local_3d8);
    local_338[0] = (EVP_PKEY_CTX)local_3d8[0];
    if (local_3d8[0] == true) {
      DynamicValue::Reader::Reader((Reader *)auStack_330,(Reader *)(local_3d8 + 8));
    }
    if (local_3d8[0] == true) {
      DynamicValue::Reader::~Reader((Reader *)(local_3d8 + 8));
    }
    if (local_338[0] == (EVP_PKEY_CTX)0x1) {
      DynamicValue::Reader::Reader(&local_f0,(Reader *)auStack_330);
      Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
                (__return_storage_ptr__,&this->orphanage,&local_f0);
      DynamicValue::Reader::~Reader(&local_f0);
      goto LAB_001ddcf8;
    }
LAB_001ddce4:
    __return_storage_ptr__->type = UNKNOWN;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
LAB_001ddcf8:
    if (local_338[0] != (EVP_PKEY_CTX)0x1) {
      return __return_storage_ptr__;
    }
    DynamicValue::Reader::~Reader((Reader *)auStack_330);
    return __return_storage_ptr__;
  case 0xd:
    pRVar1 = this->resolver;
    if (src._reader.pointerCount == 0) {
      src._reader.nestingLimit = 0x7fffffff;
      SVar14.raw = (RawBrandedSchema *)0x0;
      pWVar18 = (WirePointer *)0x0;
      pRVar21 = (RawBrandedSchema *)0x0;
    }
    auStack_328._8_4_ = src._reader.nestingLimit;
    local_338 = (undefined1  [8])pRVar21;
    auStack_330 = (undefined1  [8])SVar14.raw;
    auStack_328._0_8_ = pWVar18;
    capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)local_338,(word *)0x0);
    (*pRVar1->_vptr_Resolver[1])(local_338,pRVar1);
    uVar20 = auStack_328._0_8_;
    SVar14.raw = (RawBrandedSchema *)auStack_330;
    local_368 = local_338[0];
    if (local_338[0] == (EVP_PKEY_CTX)0x1) {
      local_360.scopeId = (uint64_t)auStack_330;
      OStack_358.tag.content._0_4_ = (uint)auStack_328._0_8_;
      OStack_358.tag.content._4_4_ = SUB84(auStack_328._0_8_,4);
      OStack_358.segment = (SegmentBuilder *)auStack_328._8_8_;
      auStack_330 = (undefined1  [8])0x0;
      auStack_328._0_8_ = (WirePointer *)0x0;
      WVar12 = LIST;
      if (local_3e8.listDepth == '\0') {
        WVar12 = local_3e8.baseType;
      }
      if (WVar12 == TEXT) {
        Orphanage::newOrphan<capnp::Text>
                  ((Orphan<capnp::Text> *)local_338,&this->orphanage,(uint)OStack_358.tag.content);
        capnp::_::OrphanBuilder::asText((Builder *)local_3d8,(OrphanBuilder *)local_338);
        memcpy((void *)local_3d8._8_8_,local_360.schema,
               CONCAT44(OStack_358.tag.content._4_4_,(uint)OStack_358.tag.content));
        Orphan<capnp::DynamicValue>::Orphan<capnp::Text>
                  (__return_storage_ptr__,(Orphan<capnp::Text> *)local_338);
        if ((Schema)auStack_330 != (Schema)0x0) {
          capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)local_338);
        }
        goto LAB_001de601;
      }
      if (WVar12 == DATA) {
        copyFrom.super_ArrayPtr<const_unsigned_char>.size_._0_4_ = (uint)OStack_358.tag.content;
        copyFrom.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)SVar14.raw;
        copyFrom.super_ArrayPtr<const_unsigned_char>.size_._4_4_ = OStack_358.tag.content._4_4_;
        Orphanage::newOrphanCopy<capnp::Data::Reader>
                  ((Orphan<capnp::Data> *)local_338,&this->orphanage,copyFrom);
        Orphan<capnp::DynamicValue>::Orphan<capnp::Data>
                  (__return_storage_ptr__,(Orphan<capnp::Data> *)local_338);
        if ((Schema)auStack_330 != (Schema)0x0) {
          capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)local_338);
        }
        goto LAB_001de601;
      }
      if (WVar12 == STRUCT) {
        if ((uVar20 & 7) == 0) {
          local_388.ptr = (word *)0x0;
          local_388.size_ = 0;
          local_388.disposer = (ArrayDisposer *)0x0;
          elementCount.raw = (RawBrandedSchema *)((ulong)uVar20 >> 3);
          if (((ulong)SVar14.raw & 7) != 0) {
            local_338 = (undefined1  [8])
                        kj::_::HeapArrayDisposer::allocateImpl
                                  (8,(size_t)elementCount.raw,(size_t)elementCount.raw,
                                   (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
            sVar22 = local_388.size_;
            pwVar8 = local_388.ptr;
            auStack_328._0_8_ = &kj::_::HeapArrayDisposer::instance;
            auStack_330 = (undefined1  [8])elementCount.raw;
            if ((RawBrandedSchema *)local_388.ptr != (RawBrandedSchema *)0x0) {
              local_388.ptr = (word *)0x0;
              local_388.size_ = 0;
              (**(code **)*(WirePointer *)local_388.disposer)
                        (local_388.disposer,pwVar8,8,sVar22,sVar22,0,local_60.segment._0_4_,
                         local_60.capTable._0_4_,local_60.data._0_4_,local_60.pointers._0_4_,
                         local_60.dataSize,local_60.nestingLimit);
            }
            local_388.ptr = (word *)local_338;
            local_388.size_ = (size_t)auStack_330;
            local_388.disposer = (ArrayDisposer *)auStack_328._0_8_;
            local_338 = (undefined1  [8])0x0;
            auStack_330 = (undefined1  [8])0x0;
            kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_338);
            memcpy(local_388.ptr,local_360.schema,
                   CONCAT44(OStack_358.tag.content._4_4_,(uint)OStack_358.tag.content));
            elementCount.raw = (RawBrandedSchema *)local_388.size_;
            SVar14.raw = (RawBrandedSchema *)local_388.ptr;
          }
          array.size_ = (size_t)elementCount.raw;
          array.ptr = (word *)SVar14.raw;
          options._8_8_ = 0x7fffffff;
          options.traversalLimitInWords = 0xffffffffffffffff;
          UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader
                    ((UnalignedFlatArrayMessageReader *)local_338,array,options);
          local_338 = (undefined1  [8])&PTR__UnalignedFlatArrayMessageReader_002cd480;
          SVar15 = Type::asStruct(&local_3e8);
          MessageReader::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                    ((Reader *)local_1b8,(MessageReader *)local_338,SVar15);
          local_3d8._0_8_ = local_1b8._0_8_;
          local_3d8._8_8_ = local_1b8._8_8_;
          local_3b8.capTable = (CapTableBuilder *)local_188;
          local_3b8.tag.content = local_1b8._32_8_;
          local_3b8.segment = (SegmentBuilder *)local_1b8._40_8_;
          local_3d8._16_8_ = local_1b8._16_8_;
          local_3d8._24_8_ = local_1b8._24_8_;
          capnp::_::OrphanBuilder::copy
                    ((OrphanBuilder *)&local_1e8,(EVP_PKEY_CTX *)(this->orphanage).arena,
                     (EVP_PKEY_CTX *)(this->orphanage).capTable);
          local_228._0_8_ = local_1b8._0_8_;
          local_210 = local_1d8;
          local_228._8_8_ = local_1e8;
          pSStack_218 = pSStack_1e0;
          Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>
                    (__return_storage_ptr__,(Orphan<capnp::DynamicStruct> *)local_228);
          if (pSStack_218 != (SegmentBuilder *)0x0) {
            capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_228 + 8));
          }
          UnalignedFlatArrayMessageReader::~UnalignedFlatArrayMessageReader
                    ((UnalignedFlatArrayMessageReader *)local_338);
          kj::Array<capnp::word>::~Array(&local_388);
          goto LAB_001de601;
        }
        uVar17 = 0;
        uVar24 = 0;
        if (0x3f < src._reader.dataSize) {
          uVar24 = (ulong)*(uint *)(puVar3 + 2);
        }
        if (0x9f < src._reader.dataSize) {
          uVar17 = (ulong)*(uint *)(puVar3 + 8);
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar24,uVar17,
                   "Embedded file is not a valid Cap\'n Proto message.",0x32);
      }
      else {
        uVar17 = 0;
        uVar24 = 0;
        if (0x3f < src._reader.dataSize) {
          uVar24 = (ulong)*(uint *)(puVar3 + 2);
        }
        if (0x9f < src._reader.dataSize) {
          uVar17 = (ulong)*(uint *)(puVar3 + 8);
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar24,uVar17,
                   "Embeds can only be used when Text, Data, or a struct is expected.",0x42);
      }
    }
    __return_storage_ptr__->type = UNKNOWN;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
LAB_001de601:
    aVar9 = local_360;
    if (local_368 != (EVP_PKEY_CTX)0x1) {
      return __return_storage_ptr__;
    }
    if (local_360.schema == (RawBrandedSchema *)0x0) {
      return __return_storage_ptr__;
    }
    uVar20 = CONCAT44(OStack_358.tag.content._4_4_,(uint)OStack_358.tag.content);
    local_360.schema = (RawBrandedSchema *)0x0;
    OStack_358.tag.content._0_4_ = 0;
    OStack_358.tag.content._4_4_ = 0;
    (*(code *)(((OStack_358.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (OStack_358.segment,aVar9.schema,1,uVar20,uVar20,0);
    return __return_storage_ptr__;
  default:
    kj::_::unreachable();
  }
  __return_storage_ptr__->type = UNKNOWN;
LAB_001de4c3:
  (__return_storage_ptr__->builder).tag.content = 0;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
  (__return_storage_ptr__->builder).location = (word *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> ValueTranslator::compileValueInner(Expression::Reader src, Type type) {
  switch (src.which()) {
    case Expression::RELATIVE_NAME: {
      auto name = src.getRelativeName();

      // The name is just a bare identifier.  It may be a literal value or an enumerant.
      kj::StringPtr id = name.getValue();

      if (type.isEnum()) {
        KJ_IF_MAYBE(enumerant, type.asEnum().findEnumerantByName(id)) {
          return DynamicEnum(*enumerant);
        }
      } else {
        // Interpret known constant values.
        if (id == "void") {
          return VOID;
        } else if (id == "true") {
          return true;
        } else if (id == "false") {
          return false;
        } else if (id == "nan") {
          return kj::nan();
        } else if (id == "inf") {
          return kj::inf();
        }
      }

      // Apparently not a literal. Try resolving it.
      KJ_IF_MAYBE(constValue, resolver.resolveConstant(src)) {
        return orphanage.newOrphanCopy(*constValue);
      } else {
        return nullptr;
      }
    }

    case Expression::ABSOLUTE_NAME:
    case Expression::IMPORT:
    case Expression::APPLICATION:
    case Expression::MEMBER:
      KJ_IF_MAYBE(constValue, resolver.resolveConstant(src)) {
        return orphanage.newOrphanCopy(*constValue);
      } else {
        return nullptr;
      }

    case Expression::EMBED:
      KJ_IF_MAYBE(data, resolver.readEmbed(src.getEmbed())) {
        switch (type.which()) {
          case schema::Type::TEXT: {
            // Sadly, we need to make a copy to add the NUL terminator.
            auto text = orphanage.newOrphan<Text>(data->size());
            memcpy(text.get().begin(), data->begin(), data->size());
            return kj::mv(text);
          }
          case schema::Type::DATA:
            // TODO(perf): It would arguably be neat to use orphanage.referenceExternalData(),
            //   since typically the data is mmap()ed and this would avoid forcing a large file
            //   to become memory-resident. However, we'd have to figure out who should own the
            //   Array<byte>. Also, we'd have to deal with the possibility of misaligned data --
            //   though arguably in that case we know it's not mmap()ed so whatever. One more
            //   thing: it would be neat to be able to reference text blobs this way too, if only
            //   we could rely on the assumption that as long as the data doesn't end on a page
            //   boundary, it will be zero-padded, thus giving us our NUL terminator (4095/4096 of
            //   the time), but this seems to require documenting constraints on the underlying
            //   file-reading interfaces. Hm.
            return orphanage.newOrphanCopy(Data::Reader(*data));
          case schema::Type::STRUCT: {
            // We will almost certainly
            if (data->size() % sizeof(word) != 0) {
              errorReporter.addErrorOn(src,
                  "Embedded file is not a valid Cap'n Proto message.");
              return nullptr;
            }
            kj::Array<word> copy;
            kj::ArrayPtr<const word> words;
            if (reinterpret_cast<uintptr_t>(data->begin()) % sizeof(void*) == 0) {
              // Hooray, data is aligned.
              words = kj::ArrayPtr<const word>(
                  reinterpret_cast<const word*>(data->begin()),
                  data->size() / sizeof(word));
            } else {
              // Ugh, data not aligned. Make a copy.
              copy = kj::heapArray<word>(data->size() / sizeof(word));
              memcpy(copy.begin(), data->begin(), data->size());
              words = copy;
            }
            ReaderOptions options;
            options.traversalLimitInWords = kj::maxValue;
            options.nestingLimit = kj::maxValue;
            FlatArrayMessageReader reader(words, options);
            return orphanage.newOrphanCopy(reader.getRoot<DynamicStruct>(type.asStruct()));
          }
          default:
            errorReporter.addErrorOn(src,
                "Embeds can only be used when Text, Data, or a struct is expected.");
            return nullptr;
        }
      } else {
        return nullptr;
      }

    case Expression::POSITIVE_INT:
      return src.getPositiveInt();

    case Expression::NEGATIVE_INT: {
      uint64_t nValue = src.getNegativeInt();
      if (nValue > ((uint64_t)kj::maxValue >> 1) + 1) {
        errorReporter.addErrorOn(src, "Integer is too big to be negative.");
        return nullptr;
      } else {
        return kj::implicitCast<int64_t>(-nValue);
      }
    }

    case Expression::FLOAT:
      return src.getFloat();
      break;

    case Expression::STRING:
      if (type.isData()) {
        Text::Reader text = src.getString();
        return orphanage.newOrphanCopy(Data::Reader(text.asBytes()));
      } else {
        return orphanage.newOrphanCopy(src.getString());
      }
      break;

    case Expression::BINARY:
      if (!type.isData()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      return orphanage.newOrphanCopy(src.getBinary());

    case Expression::LIST: {
      if (!type.isList()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      auto listSchema = type.asList();
      Type elementType = listSchema.getElementType();
      auto srcList = src.getList();
      Orphan<DynamicList> result = orphanage.newOrphan(listSchema, srcList.size());
      auto dstList = result.get();
      for (uint i = 0; i < srcList.size(); i++) {
        KJ_IF_MAYBE(value, compileValue(srcList[i], elementType)) {
          dstList.adopt(i, kj::mv(*value));
        }
      }
      return kj::mv(result);
    }

    case Expression::TUPLE: {
      if (!type.isStruct()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      auto structSchema = type.asStruct();
      Orphan<DynamicStruct> result = orphanage.newOrphan(structSchema);
      fillStructValue(result.get(), src.getTuple());
      return kj::mv(result);
    }

    case Expression::UNKNOWN:
      // Ignore earlier error.
      return nullptr;
  }

  KJ_UNREACHABLE;
}